

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O3

disp_binding_activator_t * __thiscall
so_5::disp::reuse::
binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,_so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,_so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>
            *this,environment_t *param_1,agent_ref_t *agent)

{
  atomic_refcounted_t *paVar1;
  proxy_dispatcher_t *ppVar2;
  int iVar3;
  undefined4 extraout_var;
  binding_actions_t *in_R9;
  anon_class_16_2_07130beb_conflict main_action;
  anon_class_16_2_3f0559d5 rollback_action;
  event_queue_t *ctx;
  agent_t *local_28;
  agent_ref_t local_20;
  
  local_28 = agent->m_obj;
  ppVar2 = this->m_instance;
  agent->m_obj = (agent_t *)0x0;
  iVar3 = (*(ppVar2->super_proxy_dispatcher_base_t).super_actual_disp_iface_t.super_dispatcher_t.
            _vptr_dispatcher_t[6])(ppVar2,&this->super_binding_actions_t);
  local_20.m_obj = (agent_t *)CONCAT44(extraout_var,iVar3);
  main_action.ctx = (event_queue_t **)ppVar2;
  main_action.agent = &local_20;
  rollback_action.this = in_R9;
  rollback_action.disp = (actual_disp_iface_t *)&this->super_binding_actions_t;
  details::
  do_with_rollback_on_exception<so_5::disp::active_group::impl::binding_actions_t::do_bind(so_5::disp::active_group::impl::actual_disp_iface_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda()_1_,so_5::disp::active_group::impl::binding_actions_t::do_bind(so_5::disp::active_group::impl::actual_disp_iface_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda()_2_>
            (__return_storage_ptr__,(details *)&local_28,main_action,rollback_action);
  if (local_28 != (agent_t *)0x0) {
    LOCK();
    paVar1 = &local_28->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_28 != (agent_t *)0x0)) {
      (*local_28->_vptr_agent_t[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & /* env */,
			agent_ref_t agent ) override
			{
				return this->do_bind( m_instance, std::move( agent ) );
			}